

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestApiConnection.cpp
# Opt level: O0

string * __thiscall
helics::apps::RestApiConnection::sendCommand
          (RestApiConnection *this,verb command,string *target,string *body)

{
  string_view target_00;
  bool bVar1;
  undefined1 uVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int in_EDX;
  allocator<char> *__a;
  string *in_RDI;
  optional<unsigned_long> oVar4;
  response<http::string_body> res;
  response_parser<http::empty_body> res_1;
  request<http::string_body> req;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  status in_stack_fffffffffffffcb4;
  char *in_stack_fffffffffffffcb8;
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  parser<false,_boost::beast::http::empty_body,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  field in_stack_fffffffffffffcde;
  basic_fields<std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *in_stack_fffffffffffffd48;
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *in_stack_fffffffffffffd50;
  basic_flat_buffer<std::allocator<char>_> *in_stack_fffffffffffffd58;
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  *in_stack_fffffffffffffd60;
  allocator<char> local_229;
  undefined1 local_228;
  unsigned_long local_220;
  undefined1 local_218 [8];
  allocator<char> *local_210;
  basic_parser<false> local_208 [3];
  __sv_type local_d0;
  __sv_type local_c0;
  int local_1c;
  undefined1 *local_8;
  
  local_1c = in_EDX;
  local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  target_00._M_str = (char *)in_stack_fffffffffffffcd0;
  target_00._M_len = in_stack_fffffffffffffcc8;
  boost::beast::http::
  message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
  ::message<int,void>(in_stack_fffffffffffffcc0,(verb)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                      target_00,(int)in_stack_fffffffffffffcb8);
  local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcde,
             (string_view *)in_stack_fffffffffffffcd0);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8);
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcde,
             (string_view *)in_stack_fffffffffffffcd0);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x32b717);
  if (!bVar1) {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    if (*pvVar3 == '{') {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcb8);
      boost::beast::http::basic_fields<std::allocator<char>_>::set
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcde,
                 (string_view *)in_stack_fffffffffffffcd0);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcb8);
      boost::beast::http::basic_fields<std::allocator<char>_>::set
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcde,
                 (string_view *)in_stack_fffffffffffffcd0);
    }
    boost::beast::http::
    message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
    ::body_abi_cxx11_((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                       *)0x32b7cf);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               in_stack_fffffffffffffca8);
    boost::beast::http::
    message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::prepare_payload((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  }
  std::
  unique_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
  ::operator*((unique_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
               *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  boost::beast::http::
  write<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            ((basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
              *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  if (local_1c == 3) {
    boost::beast::http::parser<false,_boost::beast::http::empty_body,_std::allocator<char>_>::parser
              (in_stack_fffffffffffffcd0);
    boost::beast::http::basic_parser<false>::skip(local_208,true);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              unique_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
              ::operator*((unique_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
                           *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    boost::beast::http::
    read<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,false>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (basic_parser<false> *)in_stack_fffffffffffffd50);
    oVar4 = boost::beast::http::basic_parser<false>::content_length((basic_parser<false> *)0x32b899)
    ;
    __a = (allocator<char> *)oVar4.super_type.m_storage;
    uVar2 = oVar4.super_type.m_initialized;
    local_8 = local_218;
    local_218[0] = uVar2;
    local_210 = __a;
    bVar1 = boost::optional<unsigned_long>::operator!((optional<unsigned_long> *)0x32b8d9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffce8),__a);
      std::allocator<char>::~allocator(&local_229);
    }
    else {
      oVar4 = boost::beast::http::basic_parser<false>::content_length
                        ((basic_parser<false> *)0x32b8ee);
      local_220 = oVar4.super_type.m_storage;
      local_228 = oVar4.super_type.m_initialized;
      boost::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x32b91e);
      CLI::std::__cxx11::to_string(CONCAT17(uVar2,in_stack_fffffffffffffce8));
    }
    boost::beast::http::parser<false,_boost::beast::http::empty_body,_std::allocator<char>_>::
    ~parser((parser<false,_boost::beast::http::empty_body,_std::allocator<char>_> *)
            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  }
  else {
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::message((message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    std::
    unique_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
    ::operator*((unique_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
                 *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    boost::beast::http::
    read<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    in_stack_fffffffffffffcb4 =
         boost::beast::http::header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>
         ::result((header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_> *)
                  0x32ba50);
    if (in_stack_fffffffffffffcb4 == not_found) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffcf0,
                 (char *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (allocator<char> *)in_stack_fffffffffffffce0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd4f);
    }
    else {
      boost::beast::http::
      message<false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
      ::body_abi_cxx11_((message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                         *)0x32bae9);
      std::__cxx11::string::string
                (in_stack_fffffffffffffcf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    }
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message((message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  }
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  return in_RDI;
}

Assistant:

std::string RestApiConnection::sendCommand(http::verb command,
                                           const std::string& target,
                                           const std::string& body)
{
    // Set up an HTTP command message
    http::request<http::string_body> req{command, target, 11};
    req.set(http::field::host, hostName);
    req.set(http::field::user_agent, "HELICS_HTTP_RESTCONNECTION");
    if (!body.empty()) {
        if (body.front() == '{') {
            req.set(http::field::content_type, "application/json");
        } else {
            req.set(http::field::content_type, "text/plain");
        }
        req.body() = body;
        req.prepare_payload();
    }
    // Send the HTTP request to the remote host
    http::write(*stream, req);
    if (command == http::verb::head) {
        // Declare a container to hold the response
        http::response_parser<http::empty_body> res;
        res.skip(true);
        // Receive the HTTP response
        http::read(*stream, buffer, res);
        return (res.content_length()) ? std::to_string(*res.content_length()) : std::string("0");
    }
    // Declare a container to hold the response
    http::response<http::string_body> res;

    // Receive the HTTP response
    http::read(*stream, buffer, res);
    if (res.result() == http::status::not_found) {
        return "#invalid";
    }
    return res.body();
}